

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  BYTE *s;
  ushort *puVar9;
  ushort *__src;
  ulong uVar10;
  byte *pbVar11;
  ushort *puVar12;
  long lVar13;
  ulong uVar14;
  ushort *puVar15;
  byte *pbVar16;
  uint uVar17;
  BYTE *d;
  byte *pbVar18;
  byte *__dest;
  byte *pbVar19;
  ushort *puVar20;
  byte *pbVar21;
  BYTE *e;
  byte *pbVar22;
  ulong uVar23;
  int local_58;
  int local_50;
  
  iVar8 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar8 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar16 = (byte *)(dest + -prefixSize);
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxOutputSize);
      __dest = (byte *)dest;
      __src = (ushort *)source;
      if (maxOutputSize < 0x40) goto LAB_0010c391;
      puVar20 = (ushort *)source;
LAB_0010bedb:
      while( true ) {
        __src = (ushort *)((long)puVar20 + 1);
        bVar3 = (byte)*puVar20;
        uVar7 = (uint)bVar3;
        uVar23 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010c3c8;
          puVar15 = puVar20 + 1;
          uVar17 = 0;
          puVar20 = puVar20 + 8;
          do {
            puVar12 = puVar20;
            puVar9 = __src;
            __src = (ushort *)((long)puVar9 + 1);
            uVar17 = uVar17 + *(byte *)((long)puVar12 + -0xf);
            puVar15 = (ushort *)((long)puVar15 + 1);
            puVar20 = (ushort *)((long)puVar12 + 1);
          } while (puVar12 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar12 + -0xf) == 0xff);
          uVar23 = (ulong)uVar17 + 0xf;
          pbVar18 = __dest + uVar23;
          if ((CARRY8((ulong)__dest,uVar23)) || ((ulong)-(long)puVar15 < uVar23)) {
            __src = puVar12 + -7;
            goto LAB_0010c3c8;
          }
          if (dest + (long)maxOutputSize + -0x20 < pbVar18) goto LAB_0010c2b2;
          puVar20 = (ushort *)((ulong)uVar17 + (long)puVar12 + 1);
          if (puVar1 + -0x10 < puVar20) {
            __src = puVar12 + -7;
            goto LAB_0010c2b2;
          }
          lVar13 = 0;
          do {
            uVar5 = *(undefined8 *)((byte *)((long)__src + lVar13) + 8);
            pbVar21 = __dest + lVar13;
            *(undefined8 *)pbVar21 = *(undefined8 *)((long)__src + lVar13);
            *(undefined8 *)(pbVar21 + 8) = uVar5;
            pbVar11 = (byte *)((long)puVar9 + lVar13 + 0x11);
            uVar5 = *(undefined8 *)(pbVar11 + 8);
            *(undefined8 *)(pbVar21 + 0x10) = *(undefined8 *)pbVar11;
            *(undefined8 *)(pbVar21 + 0x18) = uVar5;
            lVar13 = lVar13 + 0x20;
          } while (pbVar21 + 0x20 < pbVar18);
        }
        else {
          pbVar18 = __dest + uVar23;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0010c2b2;
          uVar5 = *(undefined8 *)((long)puVar20 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          puVar20 = (ushort *)(uVar23 + (long)__src);
        }
        uVar4 = *puVar20;
        uVar14 = (ulong)uVar4;
        __src = puVar20 + 1;
        pbVar21 = pbVar18 + -uVar14;
        uVar10 = (ulong)(bVar3 & 0xf);
        if (uVar10 == 0xf) break;
        __dest = pbVar18 + uVar10 + 4;
        uVar10 = uVar10 + 4;
        if (pbVar2 + -0x40 <= __dest) goto LAB_0010c332;
        if ((pbVar21 < pbVar16) || (uVar4 < 8)) goto LAB_0010c064;
        *(undefined8 *)pbVar18 = *(undefined8 *)pbVar21;
        *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar21 + 8);
        *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
        puVar20 = __src;
      }
      if (pbVar21 < pbVar16) goto LAB_0010c3c8;
      uVar7 = 0;
      puVar20 = __src;
      do {
        __src = (ushort *)((long)puVar20 + 1);
        if (puVar1 + -2 <= __src) goto LAB_0010c3c8;
        uVar6 = *puVar20;
        uVar7 = uVar7 + (byte)uVar6;
        puVar20 = __src;
      } while ((byte)uVar6 == 0xff);
      uVar23 = (ulong)uVar7;
      if ((byte *)(-0x10 - uVar23) < pbVar18) goto LAB_0010c3c8;
      uVar10 = uVar23 + 0x13;
      if (pbVar18 + uVar23 + 0x13 < pbVar2 + -0x40) {
LAB_0010c064:
        if (pbVar21 < pbVar16) goto LAB_0010c3c8;
        __dest = pbVar18 + uVar10;
        puVar20 = __src;
        if (0xf < uVar4) {
          do {
            uVar5 = *(undefined8 *)(pbVar18 + -uVar14 + 8);
            *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar14);
            *(undefined8 *)(pbVar18 + 8) = uVar5;
            uVar5 = *(undefined8 *)(pbVar18 + -uVar14 + 0x10 + 8);
            *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar14 + 0x10);
            *(undefined8 *)(pbVar18 + 0x18) = uVar5;
            pbVar18 = pbVar18 + 0x20;
          } while (pbVar18 < __dest);
          goto LAB_0010bedb;
        }
        if (uVar14 == 4) {
          iVar8 = *(int *)pbVar21;
        }
        else if (uVar4 == 2) {
          iVar8 = CONCAT22(*(undefined2 *)pbVar21,*(undefined2 *)pbVar21);
        }
        else {
          if (uVar4 != 1) {
            if (uVar4 < 8) {
              pbVar18[0] = 0;
              pbVar18[1] = 0;
              pbVar18[2] = 0;
              pbVar18[3] = 0;
              *pbVar18 = *pbVar21;
              pbVar18[1] = pbVar21[1];
              pbVar18[2] = pbVar21[2];
              pbVar18[3] = pbVar21[3];
              uVar7 = inc32table[uVar4];
              *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar21 + uVar7);
              pbVar21 = pbVar21 + ((ulong)uVar7 - (long)dec64table[uVar4]);
            }
            else {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar21;
              pbVar21 = pbVar21 + 8;
            }
            pbVar18 = pbVar18 + 8;
            do {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar21;
              pbVar18 = pbVar18 + 8;
              pbVar21 = pbVar21 + 8;
            } while (pbVar18 < __dest);
            goto LAB_0010bedb;
          }
          iVar8 = (uint)*pbVar21 * 0x1010101;
        }
        *(int *)pbVar18 = iVar8;
        *(int *)(pbVar18 + 4) = iVar8;
        if (8 < uVar10) {
          pbVar18 = pbVar18 + 8;
          do {
            *(int *)pbVar18 = iVar8;
            *(int *)(pbVar18 + 4) = iVar8;
            pbVar18 = pbVar18 + 8;
          } while (pbVar18 < __dest);
        }
        goto LAB_0010bedb;
      }
LAB_0010c332:
      do {
        if (pbVar21 < pbVar16) {
LAB_0010c3c8:
          local_50 = (int)source;
          return ~(uint)__src + local_50;
        }
        __dest = pbVar18 + uVar10;
        if ((uint)uVar14 < 8) {
          pbVar18[0] = 0;
          pbVar18[1] = 0;
          pbVar18[2] = 0;
          pbVar18[3] = 0;
          *pbVar18 = *pbVar21;
          pbVar18[1] = pbVar21[1];
          pbVar18[2] = pbVar21[2];
          pbVar18[3] = pbVar21[3];
          uVar23 = (ulong)((uint)uVar14 << 2);
          uVar14 = (ulong)*(uint *)((long)inc32table + uVar23);
          *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar21 + uVar14);
          pbVar21 = pbVar21 + (uVar14 - (long)*(int *)((long)dec64table + uVar23));
        }
        else {
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar21;
          pbVar21 = pbVar21 + 8;
        }
        pbVar11 = pbVar18 + 8;
        if (pbVar2 + -0xc < __dest) {
          if (pbVar2 + -5 < __dest) goto LAB_0010c3c8;
          pbVar18 = pbVar2 + -7;
          pbVar19 = pbVar21;
          pbVar22 = pbVar11;
          if (pbVar11 < pbVar18) {
            do {
              *(undefined8 *)pbVar22 = *(undefined8 *)pbVar19;
              pbVar22 = pbVar22 + 8;
              pbVar19 = pbVar19 + 8;
            } while (pbVar22 < pbVar18);
            pbVar21 = pbVar21 + ((long)pbVar18 - (long)pbVar11);
            pbVar11 = pbVar18;
          }
          for (; pbVar11 < __dest; pbVar11 = pbVar11 + 1) {
            bVar3 = *pbVar21;
            pbVar21 = pbVar21 + 1;
            *pbVar11 = bVar3;
          }
        }
        else {
          *(undefined8 *)pbVar11 = *(undefined8 *)pbVar21;
          if (0x10 < uVar10) {
            pbVar18 = pbVar18 + 0x10;
            do {
              pbVar21 = pbVar21 + 8;
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar21;
              pbVar18 = pbVar18 + 8;
            } while (pbVar18 < __dest);
          }
        }
LAB_0010c391:
        bVar3 = (byte)*__src;
        __src = (ushort *)((long)__src + 1);
        while( true ) {
          uVar7 = (uint)bVar3;
          if (bVar3 >> 4 == 0xf) break;
          uVar23 = (ulong)(uint)(bVar3 >> 4);
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + (long)maxOutputSize + -0x20 < __dest)) goto LAB_0010c2ac;
          uVar5 = *(undefined8 *)(__src + 4);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          pbVar18 = __dest + uVar23;
          uVar10 = (ulong)(uVar7 & 0xf);
          puVar20 = (ushort *)((long)__src + uVar23) + 1;
          uVar4 = *(ushort *)((long)__src + uVar23);
          uVar14 = (ulong)uVar4;
          pbVar21 = pbVar18 + -uVar14;
          if ((((uVar7 & 0xf) == 0xf) || (uVar4 < 8)) || (pbVar21 < pbVar16)) goto LAB_0010c2f5;
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar21;
          *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar21 + 8);
          *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
          __dest = pbVar18 + uVar10 + 4;
          bVar3 = *(byte *)((long)__src + uVar23 + 2);
          __src = (ushort *)((long)__src + uVar23 + 3);
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010c3c8;
        pbVar18 = (byte *)((long)__src + 1);
        uVar17 = 0;
        do {
          uVar4 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar17 = uVar17 + (byte)uVar4;
          pbVar18 = pbVar18 + 1;
        } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar4 == 0xff);
        uVar23 = (ulong)uVar17 + 0xf;
        if ((CARRY8((ulong)__dest,uVar23)) || ((ulong)-(long)pbVar18 < uVar23)) goto LAB_0010c3c8;
LAB_0010c2ac:
        pbVar18 = __dest + uVar23;
LAB_0010c2b2:
        puVar20 = (ushort *)((long)__src + uVar23);
        if ((pbVar2 + -0xc < pbVar18) || (puVar1 + -4 < puVar20)) {
          if ((puVar20 == puVar1) && (pbVar18 <= pbVar2)) {
            memmove(__dest,__src,uVar23);
            local_58 = (int)dest;
            return ((int)__dest + (int)uVar23) - local_58;
          }
          goto LAB_0010c3c8;
        }
        do {
          *(undefined8 *)__dest = *(undefined8 *)__src;
          __dest = __dest + 8;
          __src = __src + 4;
        } while (__dest < pbVar18);
        uVar14 = (ulong)*puVar20;
        puVar20 = puVar20 + 1;
        pbVar21 = pbVar18 + -uVar14;
        uVar10 = (ulong)(uVar7 & 0xf);
LAB_0010c2f5:
        __src = puVar20;
        if ((int)uVar10 == 0xf) {
          uVar7 = 0;
          do {
            puVar15 = puVar20;
            __src = (ushort *)((long)puVar15 + 1);
            if (puVar1 + -2 <= __src) goto LAB_0010c3c5;
            uVar7 = uVar7 + (byte)*puVar15;
            puVar20 = __src;
          } while ((byte)*puVar15 == 0xff);
          uVar10 = (ulong)uVar7 + 0xf;
          if (CARRY8((ulong)pbVar18,uVar10)) {
LAB_0010c3c5:
            __src = (ushort *)((long)puVar15 + 1);
            goto LAB_0010c3c8;
          }
        }
        uVar10 = uVar10 + 4;
      } while( true );
    }
  }
  return iVar8;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}